

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
dap::Deserializer::
deserialize<std::vector<dap::ExceptionDetails,std::allocator<dap::ExceptionDetails>>>
          (Deserializer *this,
          optional<std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>_> *opt
          )

{
  bool bVar1;
  vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_> v;
  array<dap::ExceptionDetails> local_28;
  
  local_28.super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = deserialize<dap::ExceptionDetails>(this,&local_28);
  if (bVar1) {
    optional<std::vector<dap::ExceptionDetails,std::allocator<dap::ExceptionDetails>>>::operator=
              ((optional<std::vector<dap::ExceptionDetails,std::allocator<dap::ExceptionDetails>>> *
               )opt,&local_28);
  }
  std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>::~vector(&local_28);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}